

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void TPZFMatrix<long>::PrintStatic
               (long *ptr,int64_t rows,int64_t cols,char *name,ostream *out,MatrixOutputFormat form)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  int64_t col;
  int64_t iVar5;
  long lVar6;
  long lVar7;
  long *plVar8;
  bool bVar9;
  char number [32];
  
  if (form == EMathematicaInput) {
    poVar1 = std::operator<<(out,name);
    std::operator<<(poVar1,"\n{ ");
    lVar7 = 0;
    iVar5 = cols;
    if (cols < 1) {
      iVar5 = lVar7;
    }
    lVar2 = 0;
    if (0 < rows) {
      lVar2 = rows;
    }
    for (; lVar7 != lVar2; lVar7 = lVar7 + 1) {
      std::operator<<(out,"\n{ ");
      uVar4 = 1;
      lVar6 = 0;
      plVar8 = ptr;
      while( true ) {
        if (iVar5 == lVar6) break;
        sprintf(number,"%16.16lf",ABS((double)*plVar8),uVar4 % 6);
        std::operator<<(out,number);
        if (lVar6 < cols + -1) {
          std::operator<<(out,", ");
        }
        if ((uVar4 / 6) * 6 + -1 == lVar6) {
          std::endl<char,std::char_traits<char>>(out);
        }
        plVar8 = plVar8 + rows;
        uVar4 = uVar4 + 1;
        lVar6 = lVar6 + 1;
      }
      std::operator<<(out," }");
      if (lVar7 < rows + -1) {
        std::operator<<(out,",");
      }
      ptr = ptr + 1;
    }
    std::operator<<(out," }\n");
    return;
  }
  if (form == EInputFormat) {
    poVar1 = std::ostream::_M_insert<long>((long)out);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    lVar7 = 0;
    if (cols < 1) {
      cols = lVar7;
    }
    lVar2 = 0;
    if (0 < rows) {
      lVar2 = rows;
    }
    for (; lVar7 != lVar2; lVar7 = lVar7 + 1) {
      plVar8 = ptr;
      for (lVar6 = 0; cols != lVar6; lVar6 = lVar6 + 1) {
        if (*plVar8 != 0) {
          poVar1 = std::ostream::_M_insert<long>((long)out);
          poVar1 = std::operator<<(poVar1,' ');
          poVar1 = std::ostream::_M_insert<long>((long)poVar1);
          poVar1 = std::operator<<(poVar1,' ');
          poVar1 = std::ostream::_M_insert<long>((long)poVar1);
          std::endl<char,std::char_traits<char>>(poVar1);
        }
        plVar8 = plVar8 + rows;
      }
      ptr = ptr + 1;
    }
    pcVar3 = "-1 -1 0.\n";
  }
  else {
    if (form != EFormatted) {
      return;
    }
    std::operator<<(out,"Writing matrix \'");
    if (name != (char *)0x0) {
      std::operator<<(out,name);
    }
    poVar1 = std::operator<<(out,"\' (");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    poVar1 = std::operator<<(poVar1," x ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::operator<<(poVar1,"):\n");
    lVar7 = 0;
    if (cols < 1) {
      cols = lVar7;
    }
    lVar2 = 0;
    if (0 < rows) {
      lVar2 = rows;
    }
    for (; lVar7 != lVar2; lVar7 = lVar7 + 1) {
      std::operator<<(out,"\t");
      iVar5 = cols;
      while (bVar9 = iVar5 != 0, iVar5 = iVar5 + -1, bVar9) {
        poVar1 = std::ostream::_M_insert<long>((long)out);
        std::operator<<(poVar1,"  ");
      }
      std::operator<<(out,"\n");
    }
    pcVar3 = "\n";
  }
  std::operator<<(out,pcVar3);
  return;
}

Assistant:

void TPZFMatrix<TVar>::PrintStatic(const TVar *ptr, int64_t rows, int64_t cols, const char *name, std::ostream& out,const MatrixOutputFormat form){
    
    if(form == EFormatted) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << rows << " x " << cols << "):\n";
        
        for ( int64_t row = 0; row < rows; row++) {
            out << "\t";
            for ( int64_t col = 0; col < cols; col++ ) {
                out << SELECTEL(ptr,rows, row, col) << "  ";
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EInputFormat) {
        out << rows << " " << cols << endl;
        for ( int64_t row = 0; row < rows; row++) {
            for ( int64_t col = 0; col < cols; col++ ) {
                TVar val = SELECTEL(ptr,rows,row, col);
                if(val != (TVar)0.) out << row << ' ' << col << ' ' << val << std::endl;
            }
        }
        out << "-1 -1 0.\n";
    } else if( form == EMathematicaInput)
    {
        char number[32];
        out << name << "\n{ ";
        for ( int64_t row = 0; row < rows; row++) {
            out << "\n{ ";
            for ( int64_t col = 0; col < cols; col++ ) {
                TVar val = SELECTEL(ptr,rows,row, col);
                sprintf(number, "%16.16lf", (double)fabs(val));
                out << number;
                if(col < cols-1)
                    out << ", ";
                if((col+1) % 6 == 0)out << std::endl;
            }
            out << " }";
            if(row < rows-1)
                out << ",";
        }
        
        out << " }\n";
        
    }
    
}